

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandQuaVar(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  char *pcVar3;
  uint local_48;
  int RetValue;
  int fVerbose;
  int fUniv;
  int iVar;
  int c;
  Abc_Ntk_t *pNtkRes;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pAVar2 = Abc_FrameReadNtk(pAbc);
  fVerbose = 0;
  RetValue = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    while( true ) {
      iVar1 = Extra_UtilGetopt(argc,argv,"Iuvh");
      if (iVar1 == -1) {
        if (pAVar2 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"Empty network.\n");
          return 1;
        }
        iVar1 = Abc_NtkGetChoiceNum(pAVar2);
        if (iVar1 != 0) {
          Abc_Print(-1,"This command cannot be applied to an AIG with choice nodes.\n");
          return 1;
        }
        pAVar2 = Abc_NtkStrash(pAVar2,0,1,0);
        iVar1 = Abc_NtkQuantify(pAVar2,RetValue,fVerbose,local_48);
        Abc_NtkCleanData(pAVar2);
        Abc_AigCleanup((Abc_Aig_t *)pAVar2->pManFunc);
        if (iVar1 == 0) {
          Abc_Print(-1,"Command has failed.\n");
          return 0;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar2);
        return 0;
      }
      if (iVar1 == 0x49) break;
      if (iVar1 == 0x68) goto LAB_0027b126;
      if (iVar1 == 0x75) {
        RetValue = RetValue ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto LAB_0027b126;
        local_48 = local_48 ^ 1;
      }
    }
    if (argc <= globalUtilOptind) break;
    fVerbose = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if (fVerbose < 0) {
LAB_0027b126:
      Abc_Print(-2,"usage: qvar [-I num] [-uvh]\n");
      Abc_Print(-2,"\t         quantifies one variable using the AIG\n");
      Abc_Print(-2,"\t-I num : the zero-based index of a variable to quantify [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar3 = "no";
      if (RetValue != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-u     : toggle universal quantification [default = %s]\n",pcVar3);
      pcVar3 = "no";
      if (local_48 != 0) {
        pcVar3 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar3);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_0027b126;
}

Assistant:

int Abc_CommandQuaVar( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    int c, iVar, fUniv, fVerbose, RetValue;
    extern int Abc_NtkQuantify( Abc_Ntk_t * pNtk, int fUniv, int iVar, int fVerbose );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    iVar = 0;
    fUniv = 0;
    fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Iuvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            iVar = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iVar < 0 )
                goto usage;
            break;
        case 'u':
            fUniv ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkGetChoiceNum( pNtk ) )
    {
        Abc_Print( -1, "This command cannot be applied to an AIG with choice nodes.\n" );
        return 1;
    }

    // get the strashed network
    pNtkRes = Abc_NtkStrash( pNtk, 0, 1, 0 );
    RetValue = Abc_NtkQuantify( pNtkRes, fUniv, iVar, fVerbose );
    // clean temporary storage for the cofactors
    Abc_NtkCleanData( pNtkRes );
    Abc_AigCleanup( (Abc_Aig_t *)pNtkRes->pManFunc );
    // check the result
    if ( !RetValue )
    {
        Abc_Print( -1, "Command has failed.\n" );
        return 0;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: qvar [-I num] [-uvh]\n" );
    Abc_Print( -2, "\t         quantifies one variable using the AIG\n" );
    Abc_Print( -2, "\t-I num : the zero-based index of a variable to quantify [default = %d]\n", iVar );
    Abc_Print( -2, "\t-u     : toggle universal quantification [default = %s]\n", fUniv? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}